

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricAlgorithm.cpp
# Opt level: O3

bool __thiscall SymmetricAlgorithm::generateKey(SymmetricAlgorithm *this,SymmetricKey *key,RNG *rng)

{
  undefined1 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ByteString keyBits;
  ByteString local_38;
  
  if ((rng != (RNG *)0x0) &&
     (iVar2 = (*(key->super_Serialisable)._vptr_Serialisable[7])(key),
     CONCAT44(extraout_var,iVar2) != 0)) {
    ByteString::ByteString(&local_38);
    iVar2 = (*(key->super_Serialisable)._vptr_Serialisable[7])(key);
    iVar2 = (*rng->_vptr_RNG[2])(rng,&local_38,CONCAT44(extraout_var_00,iVar2) >> 3);
    if ((char)iVar2 == '\0') {
      uVar1 = 0;
    }
    else {
      iVar2 = (*(key->super_Serialisable)._vptr_Serialisable[3])(key,&local_38);
      uVar1 = (undefined1)iVar2;
    }
    local_38._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_38.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    return (bool)uVar1;
  }
  return false;
}

Assistant:

bool SymmetricAlgorithm::generateKey(SymmetricKey& key, RNG* rng /* = NULL */)
{
	if (rng == NULL)
	{
		return false;
	}

	if (key.getBitLen() == 0)
	{
		return false;
	}

	ByteString keyBits;

	if (!rng->generateRandom(keyBits, key.getBitLen()/8))
	{
		return false;
	}

	return key.setKeyBits(keyBits);
}